

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void gl4cts::TextureViewUtilities::getComponentSizeForType(GLenum type,uint *out_rgba_size)

{
  uint uVar1;
  long lVar2;
  TestError *this;
  undefined4 uVar3;
  undefined4 uVar4;
  long lStack_20;
  
  out_rgba_size[0] = 0;
  out_rgba_size[1] = 0;
  out_rgba_size[2] = 0;
  out_rgba_size[3] = 0;
  uVar1 = type - 0x1400;
  if (uVar1 < 0xc) {
    if ((0x70U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x80cU >> (uVar1 & 0x1f) & 1) == 0) {
        if ((3U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00aa9432;
        out_rgba_size[0] = 8;
        out_rgba_size[1] = 8;
        uVar3 = 8;
      }
      else {
        out_rgba_size[0] = 0x10;
        out_rgba_size[1] = 0x10;
        uVar3 = 0x10;
      }
    }
    else {
      out_rgba_size[0] = 0x20;
      out_rgba_size[1] = 0x20;
      uVar3 = 0x20;
    }
    lVar2 = 0xc;
    lStack_20 = 8;
    uVar4 = uVar3;
    goto LAB_00aa94d8;
  }
LAB_00aa9432:
  if ((type == 0x8036) || (type == 0x8368)) {
    out_rgba_size[0] = 10;
    out_rgba_size[1] = 10;
    uVar4 = 2;
    uVar3 = 10;
  }
  else {
    if (type == 0x84fa) {
      out_rgba_size[0] = 0x18;
      out_rgba_size[1] = 8;
      lVar2 = 0xc;
      uVar3 = 0;
      lStack_20 = 8;
      uVar4 = 0;
      goto LAB_00aa94d8;
    }
    if (type == 0x8c3b) {
      *out_rgba_size = 0xb;
      uVar4 = 10;
      lVar2 = 8;
      uVar3 = 0xb;
      lStack_20 = 4;
      goto LAB_00aa94d8;
    }
    if (type == 0x8c3e) {
      out_rgba_size[0] = 9;
      out_rgba_size[1] = 9;
      uVar4 = 5;
      uVar3 = 9;
    }
    else {
      if (type != 0x8dad) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Unrecognized type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x2c4);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      out_rgba_size[0] = 8;
      out_rgba_size[1] = 0x18;
      uVar4 = 0;
      uVar3 = 0x20;
    }
  }
  lVar2 = 0xc;
  lStack_20 = 8;
LAB_00aa94d8:
  *(undefined4 *)((long)out_rgba_size + lStack_20) = uVar3;
  *(undefined4 *)((long)out_rgba_size + lVar2) = uVar4;
  return;
}

Assistant:

void TextureViewUtilities::getComponentSizeForType(const glw::GLenum type, unsigned int* out_rgba_size)
{
	memset(out_rgba_size, 0, sizeof(unsigned int) * 4 /* rgba */);

	switch (type)
	{
	case GL_BYTE:
	case GL_UNSIGNED_BYTE:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 8;
		out_rgba_size[3] = 8;

		break;
	}

	case GL_FLOAT:
	case GL_UNSIGNED_INT:
	case GL_INT:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;
		out_rgba_size[2] = 32;
		out_rgba_size[3] = 32;

		break;
	}

	case GL_FLOAT_32_UNSIGNED_INT_24_8_REV:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 24;
		out_rgba_size[2] = 32;
		out_rgba_size[3] = 0;

		break;
	}

	case GL_HALF_FLOAT:
	case GL_UNSIGNED_SHORT:
	case GL_SHORT:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;
		out_rgba_size[2] = 16;
		out_rgba_size[3] = 16;

		break;
	}

	case GL_UNSIGNED_INT_10_10_10_2:
	{
		out_rgba_size[0] = 10;
		out_rgba_size[1] = 10;
		out_rgba_size[2] = 10;
		out_rgba_size[3] = 2;

		break;
	}

	case GL_UNSIGNED_INT_10F_11F_11F_REV:
	{
		out_rgba_size[0] = 11;
		out_rgba_size[1] = 11;
		out_rgba_size[2] = 10;

		break;
	}

	case GL_UNSIGNED_INT_24_8:
	{
		out_rgba_size[0] = 24;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 0;
		out_rgba_size[3] = 0;

		break;
	}

	case GL_UNSIGNED_INT_2_10_10_10_REV:
	{
		out_rgba_size[0] = 10;
		out_rgba_size[1] = 10;
		out_rgba_size[2] = 10;
		out_rgba_size[3] = 2;

		break;
	}

	case GL_UNSIGNED_INT_5_9_9_9_REV:
	{
		out_rgba_size[0] = 9;
		out_rgba_size[1] = 9;
		out_rgba_size[2] = 9;
		out_rgba_size[3] = 5;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized type");
	}
	} /* switch (type) */
}